

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O1

void RigidBodyDynamics::ForwardDynamicsContactsDirect
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau,ConstraintSet *CS,
               VectorNd *QDDot)

{
  double *pdVar1;
  double *pdVar2;
  uint uVar3;
  double *pdVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  ulong uVar8;
  ActualDstType actualDst;
  long lVar9;
  ulong uVar10;
  VectorNd *lambda;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_38;
  
  lambda = QDDot;
  CalcContactSystemVariables(model,Q,QDot,Tau,CS);
  local_38.m_storage.m_data = (double *)0x0;
  local_38.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_38,*(Index *)(CS + 200),1);
  pdVar4 = (Tau->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  lVar5 = *(long *)(CS + 0xc0);
  if (local_38.m_storage.m_rows != *(ulong *)(CS + 200)) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&local_38,*(ulong *)(CS + 200),1);
  }
  uVar8 = local_38.m_storage.m_rows - (local_38.m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
  if (1 < local_38.m_storage.m_rows) {
    lVar9 = 0;
    do {
      pdVar1 = pdVar4 + lVar9;
      dVar6 = pdVar1[1];
      pdVar2 = (double *)(lVar5 + lVar9 * 8);
      dVar7 = pdVar2[1];
      local_38.m_storage.m_data[lVar9] = *pdVar1 - *pdVar2;
      (local_38.m_storage.m_data + lVar9)[1] = dVar6 - dVar7;
      lVar9 = lVar9 + 2;
    } while (lVar9 < (long)uVar8);
  }
  if ((long)uVar8 < local_38.m_storage.m_rows) {
    do {
      local_38.m_storage.m_data[uVar8] = pdVar4[uVar8] - *(double *)(lVar5 + uVar8 * 8);
      uVar8 = uVar8 + 1;
    } while (local_38.m_storage.m_rows != uVar8);
  }
  SolveContactSystemDirect
            ((MatrixNd *)(CS + 0xa8),(MatrixNd *)(CS + 0xe0),(VectorNd *)&local_38,
             (VectorNd *)(CS + 0xd0),(VectorNd *)(CS + 0x110),lambda,(MatrixNd *)(CS + 0xf8),
             (VectorNd *)(CS + 0x110),(VectorNd *)(CS + 0x120),(LinearSolver *)CS);
  free(local_38.m_storage.m_data);
  uVar3 = model->dof_count;
  if ((ulong)uVar3 != 0) {
    lVar5 = *(long *)(CS + 0x120);
    pdVar4 = (QDDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar8 = 0;
    do {
      pdVar4[uVar8] = *(double *)(lVar5 + uVar8 * 8);
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
  }
  uVar8 = *(ulong *)(CS + 0x70);
  if (uVar8 != 0) {
    lVar5 = *(long *)(CS + 0x78);
    lVar9 = *(long *)(CS + 0x120);
    uVar10 = 0;
    do {
      *(ulong *)(lVar5 + uVar10 * 8) =
           *(ulong *)(lVar9 + (ulong)(uVar3 + (int)uVar10) * 8) ^ 0x8000000000000000;
      uVar10 = uVar10 + 1;
    } while ((uVar10 & 0xffffffff) < uVar8);
  }
  return;
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsContactsDirect (
		Model &model,
		const VectorNd &Q,
		const VectorNd &QDot,
		const VectorNd &Tau,
		ConstraintSet &CS,
		VectorNd &QDDot
		) {
	LOG << "-------- " << __func__ << " --------" << std::endl;

	CalcContactSystemVariables (model, Q, QDot, Tau, CS);

	SolveContactSystemDirect (CS.H, CS.G, Tau - CS.C, CS.gamma, QDDot, CS.force, CS.A, CS.b, CS.x, CS.linear_solver);

	// Copy back QDDot
	for (unsigned int i = 0; i < model.dof_count; i++)
		QDDot[i] = CS.x[i];

	// Copy back contact forces
	for (unsigned int i = 0; i < CS.size(); i++) {
		CS.force[i] = -CS.x[model.dof_count + i];
	}
}